

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

void __thiscall
soplex::SVSetBase<double>::SVSetBase
          (SVSetBase<double> *this,int pmax,int pmemmax,double pfac,double pmemFac)

{
  int iVar1;
  
  iVar1 = 0x40;
  if (0 < pmax) {
    iVar1 = pmax * 8;
  }
  if (pmax < 1) {
    pmax = 8;
  }
  if (pmemmax < 1) {
    pmemmax = iVar1;
  }
  ClassArray<soplex::Nonzero<double>_>::ClassArray
            (&this->super_ClassArray<soplex::Nonzero<double>_>,0,pmemmax,pmemFac);
  (this->super_ClassArray<soplex::Nonzero<double>_>)._vptr_ClassArray =
       (_func_int **)&PTR__SVSetBase_003af6b8;
  ClassSet<soplex::SVSetBase<double>::DLPSV>::ClassSet(&this->set,pmax);
  this->unusedMem = 0;
  this->numUnusedMemUpdates = 0;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first = (DLPSV *)0x0;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last = (DLPSV *)0x0;
  (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements = false;
  this->factor = pfac;
  return;
}

Assistant:

explicit
   SVSetBase(int pmax = -1, int pmemmax = -1, double pfac = 1.1, double pmemFac = 1.2)
      : SVSetBaseArray(0, (pmemmax > 0) ? pmemmax : 8 * ((pmax > 0) ? pmax : 8), pmemFac)
      , set((pmax > 0) ? pmax : 8)
      , unusedMem(0)
      , numUnusedMemUpdates(0)
      , factor(pfac)
   {
      assert(isConsistent());
   }